

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexParameterizationQuantity::buildVertexInfoGUI
          (SurfaceVertexParameterizationQuantity *this,size_t vInd)

{
  undefined8 uVar1;
  char *in_RDI;
  undefined1 auVar2 [64];
  vec2 coord;
  size_t in_stack_00000200;
  ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *in_stack_00000208;
  char *in_stack_ffffffffffffffd8;
  float local_18;
  float fStack_14;
  undefined1 extraout_var [56];
  
  auVar2._0_8_ = render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getValue
                           (in_stack_00000208,in_stack_00000200);
  auVar2._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted(in_RDI,in_stack_ffffffffffffffd8);
  ImGui::NextColumn();
  local_18 = (float)uVar1;
  fStack_14 = (float)((ulong)uVar1 >> 0x20);
  ImGui::Text((char *)(double)local_18,(double)fStack_14,"<%g,%g>");
  ImGui::NextColumn();
  return;
}

Assistant:

void SurfaceVertexParameterizationQuantity::buildVertexInfoGUI(size_t vInd) {

  glm::vec2 coord = coords.getValue(vInd);

  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();
  ImGui::Text("<%g,%g>", coord.x, coord.y);
  ImGui::NextColumn();
}